

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O1

void duckdb::RLEScanPartialInternal<unsigned_char,false>
               (ColumnSegment *segment,ColumnScanState *state,idx_t scan_count,Vector *result,
               idx_t result_offset)

{
  byte bVar1;
  uint uVar2;
  _func_int *p_Var3;
  idx_t iVar4;
  data_ptr_t pdVar5;
  pointer pSVar6;
  _func_int **pp_Var7;
  ulong uVar8;
  ulong __n;
  ulong uVar9;
  
  pSVar6 = unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>
           ::operator->(&state->scan_state);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid
            ((optional_ptr<duckdb::FileBuffer,_true> *)(pSVar6 + 3));
  p_Var3 = pSVar6[3]._vptr_SegmentScanState[2];
  iVar4 = segment->offset;
  uVar2 = *(uint *)&pSVar6[6]._vptr_SegmentScanState;
  pdVar5 = result->data;
  Vector::SetVectorType(result,FLAT_VECTOR);
  uVar8 = scan_count + result_offset;
  do {
    uVar9 = uVar8 - result_offset;
    if (uVar8 < result_offset || uVar9 == 0) {
      return;
    }
    pp_Var7 = (_func_int **)
              (ulong)*(ushort *)
                      (p_Var3 + (long)pSVar6[4]._vptr_SegmentScanState * 2 + uVar2 + iVar4);
    __n = (long)pp_Var7 - (long)pSVar6[5]._vptr_SegmentScanState;
    bVar1 = (byte)(p_Var3 + iVar4 + 8)[(long)pSVar6[4]._vptr_SegmentScanState];
    if (uVar9 < __n) {
      switchD_00570541::default(pdVar5 + result_offset,(uint)bVar1,uVar9 + (uVar9 == 0));
      pp_Var7 = (_func_int **)((long)pSVar6[5]._vptr_SegmentScanState + uVar9);
    }
    else {
      if (pp_Var7 != pSVar6[5]._vptr_SegmentScanState) {
        switchD_00570541::default(pdVar5 + result_offset,(uint)bVar1,__n);
      }
      result_offset = result_offset + __n;
      pSVar6[4]._vptr_SegmentScanState = (_func_int **)((long)pSVar6[4]._vptr_SegmentScanState + 1);
      pp_Var7 = (_func_int **)0x0;
    }
    pSVar6[5]._vptr_SegmentScanState = pp_Var7;
  } while (__n <= uVar9);
  return;
}

Assistant:

void RLEScanPartialInternal(ColumnSegment &segment, ColumnScanState &state, idx_t scan_count, Vector &result,
                            idx_t result_offset) {
	auto &scan_state = state.scan_state->Cast<RLEScanState<T>>();

	auto data = scan_state.handle.Ptr() + segment.GetBlockOffset();
	auto data_pointer = reinterpret_cast<T *>(data + RLEConstants::RLE_HEADER_SIZE);
	auto index_pointer = reinterpret_cast<rle_count_t *>(data + scan_state.rle_count_offset);

	// If we are scanning an entire Vector and it contains only a single run
	if (CanEmitConstantVector<ENTIRE_VECTOR>(scan_state.position_in_entry, index_pointer[scan_state.entry_pos],
	                                         scan_count)) {
		RLEScanConstant<T>(scan_state, index_pointer, data_pointer, scan_count, result);
		return;
	}

	auto result_data = FlatVector::GetData<T>(result);
	result.SetVectorType(VectorType::FLAT_VECTOR);

	idx_t result_end = result_offset + scan_count;
	while (result_offset < result_end) {
		rle_count_t run_end = index_pointer[scan_state.entry_pos];
		idx_t run_count = run_end - scan_state.position_in_entry;
		idx_t remaining_scan_count = result_end - result_offset;
		T element = data_pointer[scan_state.entry_pos];
		if (DUCKDB_UNLIKELY(run_count > remaining_scan_count)) {
			for (idx_t i = 0; i < remaining_scan_count; i++) {
				result_data[result_offset + i] = element;
			}
			scan_state.position_in_entry += remaining_scan_count;
			break;
		}

		for (idx_t i = 0; i < run_count; i++) {
			result_data[result_offset + i] = element;
		}

		result_offset += run_count;
		scan_state.ForwardToNextRun();
	}
}